

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O2

int os_system_linux_netlink_drop_mc(os_system_netlink *nl,int *groups,size_t groupcount)

{
  oonf_log_source source;
  int iVar1;
  uint *__optval;
  bool bVar2;
  
  do {
    __optval = (uint *)groups;
    bVar2 = groupcount == 0;
    groupcount = groupcount - 1;
    if (bVar2) {
      return 0;
    }
    iVar1 = setsockopt((nl->socket).fd.fd,0x10e,2,__optval,4);
    groups = (int *)(__optval + 1);
  } while (iVar1 == 0);
  source = nl->used_by->logging;
  if ((log_global_mask[source] & 4) != 0) {
    oonf_log(LOG_SEVERITY_WARN,source,"src/base/os_linux/os_system_linux.c",0x1a7,(void *)0x0,0,
             "Could not drop netlink \'%s\' mc group: %x",nl->name,(ulong)*__optval);
  }
  return -1;
}

Assistant:

int
os_system_linux_netlink_drop_mc(struct os_system_netlink *nl, const int *groups, size_t groupcount) {
  size_t i;

  for (i = 0; i < groupcount; i++) {
    if (setsockopt(os_fd_get_fd(&nl->socket.fd), SOL_NETLINK, NETLINK_DROP_MEMBERSHIP, &groups[i], sizeof(groups[i]))) {
      OONF_WARN(nl->used_by->logging, "Could not drop netlink '%s' mc group: %x", nl->name, groups[i]);
      return -1;
    }
  }
  return 0;
}